

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O3

void __thiscall minihttp::TcpSocket::SetBufsizeIn(TcpSocket *this,uint s)

{
  char *__ptr;
  uint uVar1;
  
  uVar1 = 0x200;
  if (0x200 < s) {
    uVar1 = s;
  }
  __ptr = this->_inbuf;
  if (uVar1 != this->_inbufSize) {
    __ptr = (char *)realloc(__ptr,(ulong)uVar1);
    this->_inbuf = __ptr;
  }
  this->_inbufSize = uVar1;
  this->_writeSize = uVar1 - 1;
  this->_writeptr = __ptr;
  this->_readptr = __ptr;
  return;
}

Assistant:

void TcpSocket::SetBufsizeIn(unsigned int s)
{
    if(s < 512)
        s = 512;
    if(s != _inbufSize)
        _inbuf = (char*)realloc(_inbuf, s);
    _inbufSize = s;
    _writeSize = s - 1;
    _readptr = _writeptr = _inbuf;
}